

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::String> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryReadlink
          (Maybe<kj::String> *__return_storage_ptr__,InMemoryDirectory *this,PathPtr path)

{
  Disposer DVar1;
  size_t sVar2;
  String *pSVar3;
  char *pcVar4;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Array<char> local_58;
  FsNode local_38;
  Disposer local_30;
  
  sVar2 = path.parts.size_;
  pSVar3 = path.parts.ptr;
  if (sVar2 == 1) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
               &stack0xffffffffffffffc8,&this->impl);
    if ((pSVar3->content).size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pSVar3->content).ptr;
    }
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)local_30._vptr_Disposer;
    Impl::tryGetEntry((Impl *)&local_58,name);
    if ((Clock *)local_58.ptr == (Clock *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else if (*(int *)(local_58.ptr + 0x18) == 3) {
      heapString((String *)&local_58,(String *)(local_58.ptr + 0x28));
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.content.ptr = local_58.ptr;
      (__return_storage_ptr__->ptr).field_1.value.content.size_ = local_58.size_;
      (__return_storage_ptr__->ptr).field_1.value.content.disposer = local_58.disposer;
      local_58.ptr = (char *)0x0;
      local_58.size_ = 0;
      Array<char>::~Array(&local_58);
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
                ((Fault *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x6a8,FAILED,(char *)0x0,"\"not a symlink\"",(char (*) [14])"not a symlink");
      (__return_storage_ptr__->ptr).isSet = false;
      _::Debug::Fault::~Fault((Fault *)&local_58);
    }
    Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
               &stack0xffffffffffffffc8);
  }
  else if (sVar2 == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x45f,FAILED,(char *)0x0,"\"not a symlink\"",(char (*) [14])"not a symlink");
    (__return_storage_ptr__->ptr).isSet = false;
    _::Debug::Fault::~Fault((Fault *)&local_58);
  }
  else {
    if ((pSVar3->content).size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pSVar3->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar4;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffc8,name_00);
    DVar1._vptr_Disposer = local_30._vptr_Disposer;
    local_58.ptr = (char *)local_38._vptr_FsNode;
    local_58.size_ = (size_t)local_30._vptr_Disposer;
    local_30._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    if ((Waiter *)DVar1._vptr_Disposer == (Waiter *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      (**(code **)(*DVar1._vptr_Disposer + 0x60))
                (__return_storage_ptr__,DVar1._vptr_Disposer,pSVar3 + 1,sVar2 - 1);
    }
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<String> tryReadlink(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a symlink") { return kj::none; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asSymlink(lock, entry);
      } else {
        return kj::none;
      }
    }